

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

void __thiscall
re2::RE2::ReverseProg::anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this,RE2 *re)

{
  bool bVar1;
  Prog *pPVar2;
  ostream *poVar3;
  string *this_00;
  long in_RSI;
  double __x;
  string *in_stack_fffffffffffffde8;
  Regexp *in_stack_fffffffffffffdf0;
  string *psVar4;
  LogMessage *in_stack_fffffffffffffe00;
  allocator *paVar5;
  int line;
  undefined6 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2e;
  allocator in_stack_fffffffffffffe2f;
  LogMessage *in_stack_fffffffffffffe30;
  re2 local_1c0 [48];
  LogMessage local_190;
  long local_10;
  
  line = (int)((ulong)*(undefined8 *)(in_RSI + 0x68) >> 0x20);
  local_10 = in_RSI;
  Options::max_mem((Options *)(in_RSI + 0x20));
  pPVar2 = Regexp::CompileToReverseProg
                     (in_stack_fffffffffffffdf0,(int64_t)in_stack_fffffffffffffde8);
  *(Prog **)(local_10 + 0x80) = pPVar2;
  if (*(long *)(local_10 + 0x80) == 0) {
    bVar1 = Options::log_errors((Options *)(local_10 + 0x20));
    if (bVar1) {
      LogMessage::LogMessage
                (in_stack_fffffffffffffe30,
                 (char *)CONCAT17(in_stack_fffffffffffffe2f,
                                  CONCAT16(in_stack_fffffffffffffe2e,in_stack_fffffffffffffe28)),
                 line);
      poVar3 = LogMessage::stream(&local_190);
      poVar3 = std::operator<<(poVar3,"Error reverse compiling \'");
      StringPiece::StringPiece((StringPiece *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      trunc_abi_cxx11_(local_1c0,__x);
      poVar3 = std::operator<<(poVar3,(string *)local_1c0);
      std::operator<<(poVar3,"\'");
      std::__cxx11::string::~string((string *)local_1c0);
      LogMessage::~LogMessage(in_stack_fffffffffffffe00);
    }
    this_00 = (string *)operator_new(0x20);
    paVar5 = (allocator *)&stack0xfffffffffffffe2f;
    psVar4 = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this_00,"pattern too large - reverse compile failed",paVar5);
    *(string **)(local_10 + 0x88) = psVar4;
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe2f);
    *(undefined4 *)(local_10 + 0x90) = 0xe;
  }
  return;
}

Assistant:

re2::Prog* RE2::ReverseProg() const {
  std::call_once(rprog_once_, [](const RE2* re) {
    re->rprog_ =
        re->suffix_regexp_->CompileToReverseProg(re->options_.max_mem() / 3);
    if (re->rprog_ == NULL) {
      if (re->options_.log_errors())
        LOG(ERROR) << "Error reverse compiling '" << trunc(re->pattern_) << "'";
      re->error_ =
          new std::string("pattern too large - reverse compile failed");
      re->error_code_ = RE2::ErrorPatternTooLarge;
    }
  }, this);
  return rprog_;
}